

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

u32 HighsHashHelpers::modexp_M31(u32 a,u64 e)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  u32 result;
  
  uVar1 = (ulong)a;
  uVar3 = uVar1;
  if (e != 1) {
    do {
      uVar2 = (uVar3 & 0xffffffff) * (uVar3 & 0xffffffff);
      uVar2 = ((uVar2 >> 0x1f) - (uVar2 & 0xffffffff80000000)) + uVar2;
      uVar3 = uVar2 + 0x80000001;
      if (uVar2 < 0x7fffffff) {
        uVar3 = uVar2;
      }
      if ((e & 1) != 0) {
        uVar2 = (uVar3 & 0xffffffff) * uVar1;
        uVar2 = ((uVar2 >> 0x1f) - (uVar2 & 0xffffffff80000000)) + uVar2;
        uVar3 = uVar2 + 0x80000001;
        if (uVar2 < 0x7fffffff) {
          uVar3 = uVar2;
        }
      }
      a = (u32)uVar3;
      e = e >> 1;
    } while (e != 1);
  }
  return a;
}

Assistant:

static u32 modexp_M31(u32 a, u64 e) {
    // the exponent need to be greater than zero
    assert(e > 0);
    u32 result = a;

    while (e != 1) {
      // square
      result = multiply_modM31(result, result);

      // multiply with a if exponent is odd
      if (e & 1) result = multiply_modM31(result, a);

      // shift to next bit
      e = e >> 1;
    }

    return result;
  }